

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuReduce.c
# Opt level: O1

int Fxu_PreprocessCubePairs(Fxu_Matrix *p,Vec_Ptr_t *vCovers,int nPairsTotal,int nPairsMax)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  Fxu_Var *pFVar4;
  int iVar5;
  uint uVar6;
  void *__s;
  int *__s_00;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  Fxu_Cube *pFVar11;
  int iVar12;
  char *pcVar13;
  char *pcVar14;
  char cVar15;
  ulong uVar16;
  long lVar17;
  Fxu_Cube *pCube1;
  Fxu_Cube *pCube2;
  int local_58;
  
  if (nPairsTotal <= nPairsMax) {
    __assert_fail("nPairsMax < nPairsTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                  ,0x43,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
  }
  __s = malloc((long)nPairsTotal);
  memset(__s,0xff,(long)nPairsTotal);
  if (vCovers->nSize < 1) {
    local_58 = 0;
    iVar8 = -1;
  }
  else {
    iVar8 = -1;
    lVar10 = 0;
    local_58 = 0;
    do {
      pcVar13 = (char *)vCovers->pArray[lVar10];
      if (pcVar13 != (char *)0x0) {
        iVar5 = Abc_SopGetVarNum(pcVar13);
        uVar6 = Abc_SopGetVarNum(pcVar13);
        if (*pcVar13 != '\0') {
          lVar1 = (long)(int)uVar6 + 3;
          iVar12 = 0;
          pcVar14 = pcVar13;
          do {
            cVar15 = *pcVar14;
            pcVar3 = pcVar14;
            while (cVar15 != '\0') {
              if (pcVar14 != pcVar3) {
                cVar15 = '\0';
                if (0 < (int)uVar6) {
                  uVar16 = 0;
                  do {
                    cVar15 = cVar15 + (pcVar14[uVar16] != pcVar3[uVar16]);
                    uVar16 = uVar16 + 1;
                  } while (uVar6 != uVar16);
                }
                lVar17 = (long)iVar12;
                iVar12 = iVar12 + 1;
                *(char *)((long)__s + lVar17 + local_58) = cVar15;
              }
              pcVar2 = pcVar3 + lVar1;
              pcVar3 = pcVar3 + lVar1;
              cVar15 = *pcVar2;
            }
            pcVar3 = pcVar14 + lVar1;
            pcVar14 = pcVar14 + lVar1;
          } while (*pcVar3 != '\0');
        }
        iVar12 = Abc_SopGetCubeNum(pcVar13);
        local_58 = local_58 + ((iVar12 + -1) * iVar12) / 2;
        if (iVar8 <= iVar5) {
          iVar8 = iVar5;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < vCovers->nSize);
  }
  if (local_58 != nPairsTotal) {
    __assert_fail("iPair == nPairsTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                  ,0x56,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
  }
  uVar6 = iVar8 * 2;
  __s_00 = (int *)malloc((long)(int)uVar6 << 2);
  memset(__s_00,0xff,(long)(int)uVar6 << 2);
  memset(__s_00,0,(long)iVar8 << 3);
  if (0 < nPairsTotal) {
    uVar16 = 0;
    do {
      __s_00[*(byte *)((long)__s + uVar16)] = __s_00[*(byte *)((long)__s + uVar16)] + 1;
      uVar16 = uVar16 + 1;
    } while ((uint)nPairsTotal != uVar16);
  }
  if (*__s_00 == 0) {
    if (__s_00[1] == 0) {
      uVar9 = 0xffffffff;
      if (iVar8 < 1) {
        iVar8 = -1;
      }
      else {
        uVar16 = 1;
        if (1 < (int)uVar6) {
          uVar16 = (ulong)uVar6;
        }
        uVar7 = 0;
        iVar8 = 0;
        do {
          iVar8 = iVar8 + __s_00[uVar7];
          if (nPairsMax <= iVar8) {
            iVar8 = (__s_00[uVar7] + nPairsMax) - iVar8;
            uVar9 = (uint)uVar7;
            goto LAB_0043eb2f;
          }
          uVar7 = uVar7 + 1;
        } while (uVar16 != uVar7);
        iVar8 = -1;
      }
LAB_0043eb2f:
      free(__s_00);
      if (nPairsTotal < 1) {
        iVar5 = 0;
      }
      else {
        uVar16 = 0;
        iVar12 = 0;
        iVar5 = 0;
        do {
          if ((int)uVar9 < (int)(uint)*(byte *)((long)__s + uVar16)) {
            *(undefined1 *)((long)__s + uVar16) = 0;
          }
          else if (uVar9 == *(byte *)((long)__s + uVar16)) {
            if (iVar12 < iVar8) {
              iVar5 = iVar5 + 1;
              iVar12 = iVar12 + 1;
            }
            else {
              *(undefined1 *)((long)__s + uVar16) = 0;
              iVar12 = iVar12 + 1;
            }
          }
          else {
            iVar5 = iVar5 + 1;
          }
          uVar16 = uVar16 + 1;
        } while ((uint)nPairsTotal != uVar16);
      }
      if (iVar5 != nPairsMax) {
        __assert_fail("iPair == nPairsMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                      ,0x8c,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
      }
      if (vCovers->nSize < 1) {
        iVar8 = 0;
      }
      else {
        lVar10 = 0;
        iVar8 = 0;
        do {
          if (vCovers->pArray[lVar10] != (void *)0x0) {
            pFVar4 = p->ppVars[lVar10 * 2 + 1];
            pCube1 = pFVar4->pFirst;
            iVar5 = pFVar4->nCubes;
            pFVar11 = pCube1;
            if (0 < iVar5) {
              do {
                pFVar11 = pFVar11->pNext;
                iVar5 = iVar5 + -1;
              } while (iVar5 != 0);
            }
            if ((pFVar11 != (Fxu_Cube *)0x0) && (pFVar11->pVar == pFVar4)) {
              __assert_fail("pCubeLast == NULL || pCubeLast->pVar != pVar",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                            ,0x9b,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)"
                           );
            }
            for (; pCube1 != pFVar11; pCube1 = pCube1->pNext) {
              pCube2 = pCube1->pNext;
              if (pCube2 != pFVar11) {
                pcVar13 = (char *)((long)iVar8 + (long)__s);
                do {
                  if (*pcVar13 != '\0') {
                    Fxu_MatrixAddDivisor(p,pCube1,pCube2);
                  }
                  pCube2 = pCube2->pNext;
                  pcVar13 = pcVar13 + 1;
                  iVar8 = iVar8 + 1;
                } while (pCube2 != pFVar11);
              }
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < vCovers->nSize);
      }
      if (iVar8 != nPairsTotal) {
        __assert_fail("iPair == nPairsTotal",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuReduce.c"
                      ,0xa5,"int Fxu_PreprocessCubePairs(Fxu_Matrix *, Vec_Ptr_t *, int, int)");
      }
      if (__s == (void *)0x0) {
        return 1;
      }
      free(__s);
      return 1;
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    free(__s_00);
    pcVar13 = "The SOPs of the nodes are not SCC-free. Run \"bdd; sop\" before \"fx\".";
  }
  else {
    if (__s != (void *)0x0) {
      free(__s);
    }
    free(__s_00);
    pcVar13 = "The SOPs of the nodes contain duplicated cubes. Run \"bdd; sop\" before \"fx\".";
  }
  puts(pcVar13);
  return 0;
}

Assistant:

int Fxu_PreprocessCubePairs( Fxu_Matrix * p, Vec_Ptr_t * vCovers, int nPairsTotal, int nPairsMax )
{
    unsigned char * pnLitsDiff;   // storage for the counters of diff literals
    int * pnPairCounters;         // the counters of pairs for each number of diff literals
    Fxu_Cube * pCubeFirst, * pCubeLast;
    Fxu_Cube * pCube1, * pCube2;
    Fxu_Var * pVar;
    int nCubes, nBitsMax, nSum;
    int CutOffNum = -1, CutOffQuant = -1; // Suppress "might be used uninitialized"
    int iPair, iQuant, k, c;
//    abctime clk = Abc_Clock();
    char * pSopCover;
    int nFanins;

    assert( nPairsMax < nPairsTotal );

    // allocate storage for counter of diffs
    pnLitsDiff = ABC_FALLOC( unsigned char, nPairsTotal );
    // go through the covers and precompute the distances between the pairs
    iPair    =  0;
    nBitsMax = -1;
    for ( c = 0; c < vCovers->nSize; c++ )
        if ( (pSopCover = (char *)vCovers->pArray[c]) )
        {
            nFanins = Abc_SopGetVarNum(pSopCover);
            // precompute the differences
            Fxu_CountPairDiffs( pSopCover, pnLitsDiff + iPair );
            // update the counter
            nCubes = Abc_SopGetCubeNum( pSopCover );
            iPair += nCubes * (nCubes - 1) / 2;
            if ( nBitsMax < nFanins )
                nBitsMax = nFanins;
        }
    assert( iPair == nPairsTotal );

    // allocate storage for counters of cube pairs by difference
    pnPairCounters = ABC_FALLOC( int, 2 * nBitsMax );
    memset( pnPairCounters, 0, sizeof(int) * 2 * nBitsMax );
    // count the number of different pairs
    for ( k = 0; k < nPairsTotal; k++ )
        pnPairCounters[ pnLitsDiff[k] ]++;
    // determine what pairs to take starting from the lower
    // so that there would be exactly pPairsMax pairs
    if ( pnPairCounters[0] != 0 )
    {
        ABC_FREE( pnLitsDiff );
        ABC_FREE( pnPairCounters );
        printf( "The SOPs of the nodes contain duplicated cubes. Run \"bdd; sop\" before \"fx\".\n" );
        return 0;
    }
    if ( pnPairCounters[1] != 0 )
    {
        ABC_FREE( pnLitsDiff );
        ABC_FREE( pnPairCounters );
        printf( "The SOPs of the nodes are not SCC-free. Run \"bdd; sop\" before \"fx\".\n" );
        return 0;
    }
    assert( pnPairCounters[0] == 0 ); // otherwise, covers are not dup-free
    assert( pnPairCounters[1] == 0 ); // otherwise, covers are not SCC-free
    nSum = 0;
    for ( k = 0; k < 2 * nBitsMax; k++ )
    {
        nSum += pnPairCounters[k];
        if ( nSum >= nPairsMax )
        {
            CutOffNum   = k;
            CutOffQuant = pnPairCounters[k] - (nSum - nPairsMax);
            break;
        }
    }
    ABC_FREE( pnPairCounters );

    // set to 0 all the pairs above the cut-off number and quantity
    iQuant = 0;
    iPair  = 0;
    for ( k = 0; k < nPairsTotal; k++ )
        if ( pnLitsDiff[k] > CutOffNum ) 
            pnLitsDiff[k] = 0;
        else if ( pnLitsDiff[k] == CutOffNum )
        {
            if ( iQuant++ >= CutOffQuant )
                pnLitsDiff[k] = 0;
            else
                iPair++;
        }
        else
            iPair++;
    assert( iPair == nPairsMax );

    // collect the corresponding pairs and add the divisors
    iPair = 0;
    for ( c = 0; c < vCovers->nSize; c++ )
        if ( (pSopCover = (char *)vCovers->pArray[c]) )
        {
            // get the var
            pVar = p->ppVars[2*c+1];
            // get the first cube
            pCubeFirst = pVar->pFirst;
            // get the last cube
            pCubeLast = pCubeFirst;
            for ( k = 0; k < pVar->nCubes; k++ )
                pCubeLast = pCubeLast->pNext;
            assert( pCubeLast == NULL || pCubeLast->pVar != pVar );

            // go through the cube pairs
		    for ( pCube1 = pCubeFirst; pCube1 != pCubeLast; pCube1 = pCube1->pNext )
			    for ( pCube2 = pCube1->pNext; pCube2 != pCubeLast; pCube2 = pCube2->pNext )
                    if ( pnLitsDiff[iPair++] )
                    {   // create the divisors for this pair
	                    Fxu_MatrixAddDivisor( p, pCube1, pCube2 );
                    }
        }
    assert( iPair == nPairsTotal );
    ABC_FREE( pnLitsDiff );
//ABC_PRT( "Preprocess", Abc_Clock() - clk );
    return 1;
}